

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.h
# Opt level: O0

bool filesystem::create_directory(path *p)

{
  bool bVar1;
  int iVar2;
  char *__path;
  path local_40;
  int flag;
  __mode_t old_umask;
  path *p_local;
  
  _flag = p;
  bVar1 = path::is_directory(p);
  if (bVar1) {
    p_local._7_1_ = true;
  }
  else {
    local_40._36_4_ = umask(0);
    path::str_abi_cxx11_(&local_40,(path_type)_flag);
    __path = (char *)std::__cxx11::string::c_str();
    iVar2 = mkdir(__path,0x1ff);
    std::__cxx11::string::~string((string *)&local_40);
    local_40._32_4_ = iVar2;
    umask(local_40._36_4_);
    p_local._7_1_ = local_40._32_4_ == 0;
  }
  return p_local._7_1_;
}

Assistant:

inline bool create_directory(const path& p) {
    //// Radu: Do nothing if directory already exists.
    ////       This is consistent with std::experimental::filesystem::create_directory in C++17
    if (p.is_directory())
        return true;

#if defined(_WIN32)
    return CreateDirectoryW(p.wstr().c_str(), NULL) != 0;
#else
    auto old_umask = umask(0);
    auto flag = mkdir(p.str().c_str(), 0777);
    umask(old_umask);
    return flag == 0;
#endif
}